

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_and_glx_different_pointers.c
# Opt level: O2

int main(void)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Display *dpy;
  undefined8 uVar4;
  undefined8 uVar5;
  char *__s1;
  
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  dpy = get_display_or_skip();
  make_glx_context_current_or_skip(dpy);
  uVar4 = (*_epoxy_glXGetCurrentContext)();
  uVar5 = (*_epoxy_glXGetCurrentDrawable)();
  (*_epoxy_glXMakeCurrent)(dpy,uVar5,uVar4);
  cVar1 = epoxy_is_desktop_gl();
  if (cVar1 == '\0') {
    fwrite("Claimed to be ES\n",0x11,1,_stderr);
  }
  __s1 = (char *)(*_epoxy_glGetString)(0x1f00);
  printf("GLX vendor: %s\n",__s1);
  uVar2 = (*_epoxy_glCreateShader)(0x8b30);
  if (uVar2 == 0x4d2) {
    if (cVar1 != '\0') {
      iVar3 = strcmp(__s1,"libepoxy override GLX");
      return (uint)(iVar3 != 0);
    }
  }
  else {
    fprintf(_stderr,"glCreateShader() returned %d instead of %d\n",(ulong)uVar2,0x4d2);
  }
  return 1;
}

Assistant:

int main(void)
{
    bool pass = true;
#ifdef USE_EGL
    EGLDisplay egl_dpy;
    EGLContext egl_ctx;
#endif
#ifdef USE_GLX
    Display *glx_dpy;
    GLXContext glx_ctx;
    Drawable glx_draw;
#endif

    /* Force epoxy to have loaded both EGL and GLX libs already -- we
     * can't assume anything about symbol resolution based on having
     * EGL or GLX loaded.
     */
    (void)glXGetCurrentContext();
    (void)eglGetCurrentContext();

#ifdef USE_GLX
    init_glx(&glx_dpy, &glx_ctx, &glx_draw);
    pass = make_glx_current_and_test(glx_dpy, glx_ctx, glx_draw) && pass;
#endif
#ifdef USE_EGL
    init_egl(&egl_dpy, &egl_ctx);
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;
#endif

#if defined(USE_GLX) && defined(USE_EGL)
    pass = make_glx_current_and_test(glx_dpy, glx_ctx, glx_draw) && pass;
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;
#endif

    return pass != true;
}